

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getFormFieldsForPage
          (vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFPageObjectHelper *ph)

{
  bool bVar1;
  bool local_1da;
  undefined1 local_198 [80];
  QPDFFormFieldObjectHelper local_148;
  undefined1 local_110 [8];
  QPDFFormFieldObjectHelper field;
  QPDFAnnotationObjectHelper *annot;
  iterator __end1;
  iterator __begin1;
  QPDFPageObjectHelper local_b0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_78;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_60;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range1;
  undefined1 local_50 [8];
  set todo;
  QPDFPageObjectHelper *ph_local;
  QPDFAcroFormDocumentHelper *this_local;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *result;
  
  todo.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = (size_t)ph;
  analyze(this);
  QPDFObjGen::set::set((set *)local_50);
  __range1._7_1_ = 0;
  std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::vector
            (__return_storage_ptr__);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_b0,ph);
  getWidgetAnnotationsForPage(&local_78,this,&local_b0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_b0);
  local_60 = &local_78;
  __end1 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
           begin(local_60);
  annot = (QPDFAnnotationObjectHelper *)
          std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::end
                    (local_60);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                     *)&annot), bVar1) {
    field.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
         ::operator*(&__end1);
    QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
              ((QPDFAnnotationObjectHelper *)(local_198 + 0x18),
               (QPDFAnnotationObjectHelper *)
               field.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    getFieldForAnnotation(&local_148,this,(QPDFAnnotationObjectHelper *)(local_198 + 0x18));
    QPDFFormFieldObjectHelper::getTopLevelField
              ((QPDFFormFieldObjectHelper *)local_110,&local_148,(bool *)0x0);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_148);
    QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
              ((QPDFAnnotationObjectHelper *)(local_198 + 0x18));
    local_198._16_8_ = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&field);
    bVar1 = QPDFObjGen::set::add((set *)local_50,(QPDFObjGen)local_198._16_8_);
    local_1da = false;
    if (bVar1) {
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_198);
      local_1da = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_198);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_198);
    }
    if (local_1da != false) {
      std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::push_back
                (__return_storage_ptr__,(value_type *)local_110);
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_110);
    __gnu_cxx::
    __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            (&local_78);
  __range1._7_1_ = 1;
  QPDFObjGen::set::~set((set *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFFormFieldObjectHelper>
QPDFAcroFormDocumentHelper::getFormFieldsForPage(QPDFPageObjectHelper ph)
{
    analyze();
    QPDFObjGen::set todo;
    std::vector<QPDFFormFieldObjectHelper> result;
    for (auto& annot: getWidgetAnnotationsForPage(ph)) {
        auto field = getFieldForAnnotation(annot).getTopLevelField();
        if (todo.add(field) && field.getObjectHandle().isDictionary()) {
            result.push_back(field);
        }
    }
    return result;
}